

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix.c
# Opt level: O3

void CRadix(LPPSTR a,UINT n)

{
  Stack *pSVar1;
  int *piVar2;
  uint uVar3;
  int d;
  uchar *puVar4;
  LPPSTR ta;
  LPBYTE __ptr;
  LPPSTR ppuVar5;
  UINT i;
  ulong uVar6;
  byte bVar7;
  byte *pbVar8;
  size_t __n;
  void *__src;
  uchar **a_00;
  ulong uVar9;
  ulong uVar10;
  UINT d_00;
  ulong uVar11;
  ulong uVar12;
  ulong *count_00;
  long lVar13;
  byte *__src_00;
  UINT count [256];
  LPPSTR GrpKP [256];
  LPSTR GrpKB [256];
  UINT local_1838;
  ulong local_1830 [255];
  LPPSTR local_1038;
  long alStack_1030 [255];
  byte *local_838 [257];
  
  ta = (LPPSTR)malloc(n * 8);
  __ptr = (LPBYTE)malloc(n * 4);
  sp->sa = a;
  sp->sk = __ptr;
  sp->sn = (int)n;
  pSVar1 = sp + 1;
  piVar2 = &sp->sb;
  sp = pSVar1;
  *piVar2 = 0;
  memset(&local_1838,0,0x7f8);
  if (stack < pSVar1) {
    sp = pSVar1;
    do {
      count_00 = &local_1838;
      pSVar1 = sp + -1;
      a_00 = sp[-1].sa;
      __src_00 = sp[-1].sk;
      uVar3 = sp[-1].sn;
      uVar12 = (ulong)(int)uVar3;
      d = sp[-1].sb;
      d_00 = (UINT)d;
      sp = pSVar1;
      if (__src_00 == (byte *)0x0) {
LAB_00250354:
        RDFK(&local_1038,a_00,uVar12,ta,count_00,d_00);
      }
      else {
        uVar11 = d_00 & 3;
        if (uVar11 == 0) {
          if (uVar3 < 0x81) goto LAB_00250354;
          uVar6 = 0;
          pbVar8 = __src_00;
          do {
            puVar4 = a_00[uVar6];
            (&local_1838)[puVar4[d_00]] = (&local_1838)[puVar4[d_00]] + 1;
            bVar7 = puVar4[d_00];
            if (bVar7 == 0) {
              lVar13 = 4;
LAB_00250177:
              *pbVar8 = 0;
              pbVar8 = pbVar8 + lVar13;
            }
            else {
              uVar10 = 0;
              do {
                uVar9 = uVar10;
                pbVar8[uVar9] = bVar7;
                uVar10 = uVar9 + 1;
                bVar7 = puVar4[uVar9 + d_00 + 1];
                if (bVar7 == 0) break;
              } while (uVar9 < 3);
              pbVar8 = pbVar8 + uVar10;
              if (uVar9 < 3) {
                lVar13 = 4 - uVar10;
                goto LAB_00250177;
              }
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar12);
        }
        else if (uVar3 != 0) {
          uVar6 = uVar12;
          pbVar8 = __src_00;
          do {
            (&local_1838)[*pbVar8] = (&local_1838)[*pbVar8] + 1;
            pbVar8 = pbVar8 + (4 - uVar11);
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        do {
          uVar6 = *count_00;
          count_00 = count_00 + 1;
        } while (uVar6 == 0);
        __n = uVar12 * 8;
        uVar10 = uVar11 ^ 3;
        local_1038 = a_00;
        local_838[0] = __src_00;
        lVar13 = 0;
        ppuVar5 = a_00;
        pbVar8 = __src_00;
        do {
          ppuVar5 = ppuVar5 + (&local_1838)[lVar13];
          alStack_1030[lVar13] = (long)ppuVar5;
          pbVar8 = pbVar8 + (&local_1838)[lVar13] * uVar10;
          local_838[lVar13 + 1] = pbVar8;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0xff);
        lVar13 = 4 - uVar11;
        if (uVar12 <= uVar6) {
          __n = 0;
        }
        memcpy(ta,a_00,__n);
        if (uVar6 < uVar12) {
          uVar6 = 0;
          pbVar8 = __src_00;
          do {
            *(uchar **)alStack_1030[(ulong)*pbVar8 - 1] = ta[uVar6];
            alStack_1030[(ulong)*pbVar8 - 1] = alStack_1030[(ulong)*pbVar8 - 1] + 8;
            uVar6 = uVar6 + 1;
            pbVar8 = pbVar8 + lVar13;
          } while (uVar12 != uVar6);
        }
        memcpy(ta,__src_00,lVar13 * uVar12);
        if (uVar3 != 0) {
          __src = (void *)((long)ta + 1);
          do {
            bVar7 = *(byte *)((long)__src + -1);
            pbVar8 = local_838[bVar7];
            if ((int)uVar11 != 3) {
              memcpy(pbVar8,__src,uVar10 + (uVar10 == 0));
            }
            local_838[bVar7] = pbVar8 + uVar10;
            __src = (void *)((long)__src + lVar13);
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
        lVar13 = 0;
        do {
          if (lVar13 != 0) {
            uVar12 = (&local_1838)[lVar13];
            if (uVar12 < 0x15) {
              if (1 < uVar12) {
                isort(a_00,(int)uVar12,d);
              }
            }
            else {
              sp->sa = a_00;
              sp->sk = __src_00;
              sp->sn = (int)uVar12;
              piVar2 = &sp->sb;
              sp = sp + 1;
              *piVar2 = d + 1;
            }
          }
          a_00 = a_00 + (&local_1838)[lVar13];
          __src_00 = __src_00 + (&local_1838)[lVar13] * uVar10;
          (&local_1838)[lVar13] = 0;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0xff);
      }
    } while (stack < sp);
  }
  free(ta);
  free(__ptr);
  return;
}

Assistant:

void CRadix(LPPSTR a, UINT n)
{
	UINT kbsd, kbsd1, i, j, stage, d, MEMSIZE;
	UINT *cptr, gs, count[AS];
	LPSTR tj, tk, ax, tl, kb, ss, tt, GrpKB[AS];
	LPPSTR GrpKP[AS], ak, ta, tc, t;
	if (sizeof(LPPSTR)>sizeof(unsigned char)*BS)
		MEMSIZE=sizeof(LPPSTR);
	else
		MEMSIZE=sizeof(unsigned char)*BS;
	/* workspace */
	ta = (LPPSTR)malloc(n * MEMSIZE);
	/* memory for key buffers */
	tk = (LPBYTE)malloc(n * sizeof(unsigned char) * BS);
	tj=tk;
	push(a, tk, n, 0); for (i=AL; i<AH; i++) count[i]=0;
	while (!stackempty()) {
		pop(a, tk, n, stage);
		if (tk) {
			/* set the counters and
			   fill the key buffers if necessary */
			if ((d=stage%BS)!=0)
				for (i=0, tl=tk; i<n; i++, tl+=(BS-d))
					count[*tl]++;
			else {
				if (n>KBC)
					FillKeyBuffer(a, tk, count, n, stage);
				else {
					RDFK(GrpKP, a, n, ta, count, stage);
					continue;
				}
			}
			/* check if there is only 1 group */
			cptr=&count[AL];
			while (*cptr<1) cptr++;
			if (*cptr<n) gs=n; else gs=0;
			/* calculate both key ptr and
			   key buffer addresses */
			kbsd=BS-d, kbsd1=kbsd-1;
			GrpKP[AL]=a; GrpKB[AL]=tk;
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				GrpKP[i+1]=ak+=count[i];
				GrpKB[i+1]=ax+=count[i]*kbsd1;
			}

			/* permute the key ptrs */
			memcpy(ta, a, sizeof(LPSTR)*gs);
			for (i=0, ax=tk, tc=ta; i<gs;
					i++, ax+=kbsd, tc++) {
				*GrpKP[*ax]=*tc; GrpKP[*ax]++;
			}
			/* permute the key buffers */
			memcpy(ta, tk, sizeof(unsigned char)*n*kbsd);
			for (i=0, kb=(LPBYTE)ta; i<n; i++, *t+=kbsd1) {
				t=&GrpKB[*kb]; ss=*t; tt=kb+1;
				for (j=0; j<kbsd1; j++)
				{ *ss=*tt; ss++; tt++; }
				kb+=kbsd;
			}
			/* down 1 level */
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				if (splittable(i))
				{ push(ak, ax, count[i], stage+1); }
				else if (count[i]>1 && i>0)
					isort(ak, count[i], stage);
				ak+=count[i]; ax+=count[i]*(kbsd1);
				count[i]=0;
			}
		}
		else RDFK(GrpKP, a, n, ta, count, stage);
	}
	free((void*)ta);
	free((void*)tj);
}